

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int worker_aux(worker_t *w)

{
  int iVar1;
  int iVar2;
  bgzf_mtaux_t *pbVar3;
  int iVar4;
  int clen;
  int local_2c;
  
  pthread_mutex_lock((pthread_mutex_t *)&w->mt->lock);
  while ((w->toproc == 0 && (pbVar3 = w->mt, pbVar3->done == 0))) {
    pthread_cond_wait((pthread_cond_t *)&pbVar3->cv,(pthread_mutex_t *)&pbVar3->lock);
  }
  iVar4 = w->mt->done;
  w->toproc = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&w->mt->lock);
  iVar1 = 1;
  if (iVar4 == 0) {
    w->errcode = 0;
    iVar4 = w->i;
    pbVar3 = w->mt;
    if (iVar4 < pbVar3->curr) {
      do {
        local_2c = 0x10000;
        iVar2 = bgzf_compress(w->buf,&local_2c,pbVar3->blk[iVar4],pbVar3->len[iVar4],
                              w->compress_level);
        iVar1 = local_2c;
        if (iVar2 != 0) {
          *(byte *)&w->errcode = (byte)w->errcode | 1;
        }
        memcpy(w->mt->blk[iVar4],w->buf,(long)local_2c);
        pbVar3 = w->mt;
        pbVar3->len[iVar4] = iVar1;
        iVar4 = pbVar3->n_threads + iVar4;
        pbVar3 = w->mt;
      } while (iVar4 < pbVar3->curr);
    }
    LOCK();
    pbVar3->proc_cnt = pbVar3->proc_cnt + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int worker_aux(worker_t *w)
{
    int i, stop = 0;
    // wait for condition: to process or all done
    pthread_mutex_lock(&w->mt->lock);
    while (!w->toproc && !w->mt->done)
        pthread_cond_wait(&w->mt->cv, &w->mt->lock);
    if (w->mt->done) stop = 1;
    w->toproc = 0;
    pthread_mutex_unlock(&w->mt->lock);
    if (stop) return 1; // to quit the thread
    w->errcode = 0;
    for (i = w->i; i < w->mt->curr; i += w->mt->n_threads) {
        int clen = BGZF_MAX_BLOCK_SIZE;
        if (bgzf_compress(w->buf, &clen, w->mt->blk[i], w->mt->len[i], w->compress_level) != 0)
            w->errcode |= BGZF_ERR_ZLIB;
        memcpy(w->mt->blk[i], w->buf, clen);
        w->mt->len[i] = clen;
    }
    __sync_fetch_and_add(&w->mt->proc_cnt, 1);
    return 0;
}